

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

Value * __thiscall
GlobOpt::OptSrc(GlobOpt *this,Opnd *opnd,Instr **pInstr,Value **indirIndexValRef,
               IndirOpnd *parentIndirOpnd)

{
  OpCode OVar1;
  _func_int **pp_Var2;
  Loop *loop;
  SymIdToInstrMap *this_00;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  SymKind SVar6;
  BOOLEAN BVar7;
  ArgSlot AVar8;
  ValueType valueType_00;
  ObjectType OVar9;
  ObjectType OVar10;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar11;
  int32 intConst;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar12;
  IntConstOpnd *this_01;
  Value *pVVar13;
  AddrOpnd *addrOpnd;
  Int64ConstOpnd *pIVar14;
  IndirOpnd *pIVar15;
  FloatConstOpnd *pFVar16;
  PropertySym *propertySym;
  RegOpnd *pRVar17;
  StackSym *pSVar18;
  Value *pVVar19;
  PropertySym *pPVar20;
  SymOpnd *pSVar21;
  PropertySymOpnd *pPVar22;
  ProfiledInstr *pPVar23;
  JITTimeProfileInfo *this_02;
  Opnd *pOVar24;
  Instr *pIVar25;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar26;
  BasicBlock *pBVar27;
  GlobOpt *this_03;
  ValueType *pVVar28;
  SymID *key;
  byte bVar29;
  PropertySym *local_68;
  Instr *local_58;
  int32 int32Value;
  RegOpnd *local_48;
  Opnd *opnd_local;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [3];
  ValueType profiledArrayType;
  ValueType valueType;
  
  local_48 = (RegOpnd *)opnd;
  opnd_local = (Opnd *)pInstr;
  if ((indirIndexValRef != (Value **)0x0) && (*indirIndexValRef != (Value *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0xd07,"(!indirIndexValRef || !*indirIndexValRef)",
                       "!indirIndexValRef || !*indirIndexValRef");
    if (!bVar4) goto LAB_00426589;
    *puVar12 = 0;
  }
  if (parentIndirOpnd == (IndirOpnd *)0x0) {
    pp_Var2 = opnd_local->_vptr_Opnd;
    if ((((Opnd *)pp_Var2[9] != opnd) && ((Opnd *)pp_Var2[10] != opnd)) &&
       (((Opnd *)pp_Var2[8] != opnd || (bVar4 = IR::Opnd::IsIndirOpnd(opnd), !bVar4))))
    goto LAB_0042578e;
  }
  else if ((parentIndirOpnd->m_baseOpnd != (RegOpnd *)opnd) &&
          (parentIndirOpnd->m_indexOpnd != (RegOpnd *)opnd)) {
LAB_0042578e:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0xd0b,
                       "(parentIndirOpnd ? opnd == parentIndirOpnd->GetBaseOpnd() || opnd == parentIndirOpnd->GetIndexOpnd() : opnd == instr->GetSrc1() || opnd == instr->GetSrc2() || opnd == instr->GetDst() && opnd->IsIndirOpnd())"
                       ,
                       "parentIndirOpnd ? opnd == parentIndirOpnd->GetBaseOpnd() || opnd == parentIndirOpnd->GetIndexOpnd() : opnd == instr->GetSrc1() || opnd == instr->GetSrc2() || opnd == instr->GetDst() && opnd->IsIndirOpnd()"
                      );
    if (!bVar4) goto LAB_00426589;
    *puVar12 = 0;
  }
  OVar5 = IR::Opnd::GetKind(opnd);
  pVVar13 = (Value *)0x0;
  switch(OVar5) {
  case OpndKindIntConst:
    this_01 = IR::Opnd::AsIntConstOpnd(opnd);
    intConst = IR::IntConstOpnd::AsInt32(this_01);
LAB_00425819:
    pVVar13 = GetIntConstantValue(this,intConst,(Instr *)opnd_local->_vptr_Opnd,(Opnd *)0x0);
    break;
  case OpndKindInt64Const:
    pIVar14 = IR::Opnd::AsInt64ConstOpnd(opnd);
    pVVar13 = GetIntConstantValue(this,(pIVar14->super_EncodableOpnd<long>).m_value,
                                  (Instr *)opnd_local->_vptr_Opnd,(Opnd *)0x0);
    break;
  case OpndKindFloatConst:
    pFVar16 = IR::Opnd::AsFloatConstOpnd(opnd);
    _int32Value = (GlobOpt *)pFVar16->m_value;
    bVar4 = Js::JavascriptNumber::TryGetInt32Value<false>((double)_int32Value,(int32 *)&local_58);
    if (bVar4) {
      pVVar13 = GetIntConstantValue(this,(int32)local_58,(Instr *)opnd_local->_vptr_Opnd,(Opnd *)0x0
                                   );
    }
    else {
      pVVar13 = NewFloatConstantValue(this,(FloatConstType)_int32Value,(Opnd *)0x0);
    }
    aVar26 = (anon_union_2_4_ea848c7b_for_ValueType_13)
             *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
              &(pVVar13->valueInfo->super_ValueType).field_0.field_0;
    opnd = &local_48->super_Opnd;
    goto LAB_00425c77;
  default:
    goto switchD_00425807_caseD_4;
  case OpndKindSym:
    pVVar28 = &ValueType::Uninitialized;
    _int32Value = this;
    IR::Opnd::SetValueType(opnd,(ValueType)0x9);
    pSVar21 = IR::Opnd::AsSymOpnd(opnd);
    pPVar20 = (PropertySym *)pSVar21->m_sym;
    SVar6 = (pPVar20->super_Sym).m_kind;
    if (SVar6 == SymKindStack) {
      pSVar18 = Sym::AsStackSym((Sym *)pPVar20);
      bVar4 = StackSym::IsArgSlotSym(pSVar18);
      if (bVar4) goto LAB_00426083;
      SVar6 = (pPVar20->super_Sym).m_kind;
      if (SVar6 == SymKindStack) {
        pSVar18 = Sym::AsStackSym((Sym *)pPVar20);
        pOVar24 = opnd_local;
        if ((pSVar18->field_0x1a & 0x40) != 0) {
          bVar4 = Func::IsLoopBody((Func *)opnd_local->_vptr_Opnd[4]);
          if ((!bVar4) && (bVar4 = Func::HasProfileInfo((Func *)pOVar24->_vptr_Opnd[4]), bVar4)) {
            pSVar18 = Sym::AsStackSym((Sym *)pPVar20);
            AVar8 = StackSym::GetParamSlotNum(pSVar18);
            if (1 < AVar8) {
              this_02 = Func::GetReadOnlyProfileInfo((Func *)opnd_local->_vptr_Opnd[4]);
              valueType_00 = JITTimeProfileInfo::GetParameterInfo(this_02,AVar8 - 2);
              pVVar13 = NewGenericValue(_int32Value,valueType_00);
              break;
            }
          }
          goto LAB_00426083;
        }
        SVar6 = (pPVar20->super_Sym).m_kind;
      }
    }
    if (SVar6 != SymKindProperty) {
LAB_00425b91:
      local_68 = (PropertySym *)0x0;
      this_03 = _int32Value;
      goto LAB_00425ca7;
    }
    local_68 = Sym::AsPropertySym((Sym *)pPVar20);
    pPVar20 = Sym::AsPropertySym(&local_68->super_Sym);
    if ((pPVar20->m_propertyId == 0x1cf) &&
       (pPVar20 = Sym::AsPropertySym(&local_68->super_Sym), (pPVar20->super_Sym).field_0x15 == '\0')
       ) {
      pSVar21 = IR::Opnd::AsSymOpnd(opnd);
      bVar4 = IR::SymOpnd::IsPropertySymOpnd(pSVar21);
      if (bVar4) {
        pIVar25 = (Instr *)opnd_local->_vptr_Opnd;
        pPVar22 = IR::Opnd::AsPropertySymOpnd(opnd);
        this_03 = _int32Value;
LAB_004260c7:
        FinishOptPropOp(this_03,pIVar25,pPVar22,(BasicBlock *)0x0,false,(bool *)0x0,(bool *)0x0);
        return (Value *)0x0;
      }
    }
    else {
      pVVar13 = GlobOptBlockData::FindValue
                          (&_int32Value->currentBlock->globOptData,&local_68->m_stackSym->super_Sym)
      ;
      pSVar21 = IR::Opnd::AsSymOpnd(opnd);
      if (pVVar13 != (Value *)0x0) {
        pVVar28 = &pVVar13->valueInfo->super_ValueType;
      }
      (pSVar21->propertyOwnerValueType).field_0 = pVVar28->field_0;
      pSVar21 = IR::Opnd::AsSymOpnd(opnd);
      pOVar24 = opnd_local;
      this_03 = _int32Value;
      pPVar20 = CopyPropPropertySymObj(_int32Value,pSVar21,(Instr *)opnd_local->_vptr_Opnd);
      bVar4 = DoFieldCopyProp(this_03);
      if (bVar4) {
        OVar1 = ((Instr *)pOVar24->_vptr_Opnd)->m_opcode;
        if ((OVar1 - 0x80 < 0xc) && ((0xc4fU >> (OVar1 - 0x80 & 0x1f) & 1) != 0)) {
          return (Value *)0x0;
        }
        if ((OVar1 - 500 < 5) && ((0x13U >> (OVar1 - 500 & 0x1f) & 1) != 0)) {
          return (Value *)0x0;
        }
        if (OVar1 - 0x102 < 2) {
          return (Value *)0x0;
        }
        if (OVar1 == BrOnHasLocalProperty) {
          return (Value *)0x0;
        }
        if (OVar1 == BrOnNoLocalProperty) {
          return (Value *)0x0;
        }
        bVar4 = IR::Instr::CallsGetter((Instr *)pOVar24->_vptr_Opnd);
        if (!bVar4) {
          if ((this_03->prePassLoop != (Loop *)0x0) &&
             (bVar4 = DoFieldPRE(this_03,this_03->rootLoopPrePass), pOVar24 = opnd_local, bVar4)) {
            if (((this_03->prePassLoop->field_0x178 & 0x80) == 0) &&
               (BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                                  (this_03->prePassLoop->fieldKilled,(pPVar20->super_Sym).m_id),
               BVar7 == '\0')) {
              loop = this_03->rootLoopPrePass;
              pIVar25 = (Instr *)opnd_local->_vptr_Opnd;
              propertySym = Sym::AsPropertySym(&pPVar20->super_Sym);
              pOVar24 = opnd_local;
              SetLoopFieldInitialValue(this_03,loop,pIVar25,propertySym,local_68);
            }
            bVar4 = IsPREInstrCandidateLoad(*(OpCode *)(pOVar24->_vptr_Opnd + 6));
            if (bVar4) {
              key = &(pPVar20->super_Sym).m_id;
              bVar4 = JsUtil::
                      BaseDictionary<unsigned_int,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                      ::ContainsKey(this_03->prePassInstrMap,key);
              if (!bVar4) {
                this_00 = this_03->prePassInstrMap;
                local_58 = IR::Instr::CopyWithoutDst((Instr *)opnd_local->_vptr_Opnd);
                JsUtil::
                BaseDictionary<unsigned_int,IR::Instr*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                ::
                Insert<(JsUtil::BaseDictionary<unsigned_int,IR::Instr*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                          ((BaseDictionary<unsigned_int,IR::Instr*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                            *)this_00,key,&local_58);
              }
            }
          }
          goto LAB_00425ca7;
        }
      }
      else {
        pSVar21 = IR::Opnd::AsSymOpnd(opnd);
        bVar4 = IR::SymOpnd::IsPropertySymOpnd(pSVar21);
        if (bVar4) {
          pIVar25 = (Instr *)opnd_local->_vptr_Opnd;
          pPVar22 = IR::Opnd::AsPropertySymOpnd(opnd);
          goto LAB_004260c7;
        }
      }
    }
    goto LAB_00426083;
  case OpndKindReg:
    IR::Opnd::SetValueType(opnd,(ValueType)0x9);
    pRVar17 = IR::Opnd::AsRegOpnd(opnd);
    pPVar20 = (PropertySym *)pRVar17->m_sym;
    pBVar27 = this->currentBlock;
    pIVar25 = (Instr *)opnd_local->_vptr_Opnd;
    _int32Value = this;
    pRVar17 = IR::Opnd::AsRegOpnd(opnd);
    GlobOptBlockData::MarkTempLastUse(&pBVar27->globOptData,pIVar25,pRVar17);
    pSVar18 = Sym::AsStackSym((Sym *)pPVar20);
    if ((pSVar18->field_0x1a & 1) == 0) goto LAB_00425b91;
    pSVar18 = Sym::AsStackSym((Sym *)pPVar20);
    this_03 = _int32Value;
    pPVar20 = (PropertySym *)StackSym::GetVarEquivSym(pSVar18,_int32Value->func);
    local_68 = (PropertySym *)0x0;
LAB_00425ca7:
    pVVar13 = GlobOptBlockData::FindValue(&this_03->currentBlock->globOptData,&pPVar20->super_Sym);
    pOVar24 = opnd_local;
    if (pVVar13 == (Value *)0x0) {
      bVar4 = IR::Instr::TransfersSrcValue((Instr *)opnd_local->_vptr_Opnd);
      if (((bVar4) || (bVar4 = OpCodeAttr::CanCSE(*(OpCode *)(pOVar24->_vptr_Opnd + 6)), bVar4)) &&
         ((local_48 == (RegOpnd *)pOVar24->_vptr_Opnd[9] ||
          (local_48 == (RegOpnd *)pOVar24->_vptr_Opnd[10])))) {
        if ((pPVar20->super_Sym).m_kind == SymKindProperty) {
          pPVar20 = Sym::AsPropertySym(&pPVar20->super_Sym);
          pVVar13 = CreateFieldSrcValue(this_03,pPVar20,local_68,(Opnd **)&local_48,
                                        (Instr *)pOVar24->_vptr_Opnd);
        }
        else {
          pVVar13 = NewGenericValue(this_03,(ValueType)0x9,&local_48->super_Opnd);
        }
      }
      else {
        pVVar13 = (Value *)0x0;
      }
    }
    else {
      bVar4 = GlobOptBlockData::IsLive(&this_03->currentBlock->globOptData,&pPVar20->super_Sym);
      if ((!bVar4) && ((pPVar20->super_Sym).m_kind != SymKindProperty)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0xdc5,"(CurrentBlockData()->IsLive(sym) || (sym->IsPropertySym()))",
                           "CurrentBlockData()->IsLive(sym) || (sym->IsPropertySym())");
        if (!bVar4) goto LAB_00426589;
        *puVar12 = 0;
      }
      pOVar24 = opnd_local;
      if ((Instr *)opnd_local->_vptr_Opnd != (Instr *)0x0) {
        local_48 = (RegOpnd *)
                   CopyProp(this_03,&local_48->super_Opnd,(Instr *)opnd_local->_vptr_Opnd,pVVar13,
                            parentIndirOpnd);
      }
      if (local_48 == (RegOpnd *)0x0) goto LAB_00426083;
      if (((((this_03->prePassLoop != (Loop *)0x0) && ((pPVar20->super_Sym).m_kind == SymKindStack))
           && (BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                                 (this_03->rootLoopPrePass->symsUsedBeforeDefined,
                                  (pPVar20->super_Sym).m_id), BVar7 == '\0')) &&
          ((bVar4 = GlobOptBlockData::IsLive
                              (&this_03->rootLoopPrePass->landingPad->globOptData,
                               &pPVar20->super_Sym), bVar4 && ((this_03->field_0xf7 & 2) == 0)))) &&
         ((pVVar19 = GlobOptBlockData::FindValue
                               (&this_03->rootLoopPrePass->landingPad->globOptData,
                                &pPVar20->super_Sym), pVVar19 != (Value *)0x0 &&
          (pVVar13->valueNumber == pVVar19->valueNumber)))) {
        BVSparse<Memory::JitArenaAllocator>::Set
                  (this_03->rootLoopPrePass->symsUsedBeforeDefined,(pPVar20->super_Sym).m_id);
        pVVar28 = &pVVar19->valueInfo->super_ValueType;
        bVar4 = ValueType::IsLikelyNumber(pVVar28);
        if (bVar4) {
          BVSparse<Memory::JitArenaAllocator>::Set
                    (this_03->rootLoopPrePass->likelyNumberSymsUsedBeforeDefined,
                     (pPVar20->super_Sym).m_id);
          if ((this_03->field_0xf5 & 2) == 0) {
            bVar4 = ValueType::IsInt(pVVar28);
          }
          else {
            bVar4 = ValueType::IsLikelyInt(pVVar28);
          }
          if (bVar4 != false) {
            BVSparse<Memory::JitArenaAllocator>::Set
                      (this_03->rootLoopPrePass->likelyIntSymsUsedBeforeDefined,
                       (pPVar20->super_Sym).m_id);
          }
        }
      }
    }
    bVar4 = IR::Opnd::IsSymOpnd(&local_48->super_Opnd);
    if (bVar4) {
      pSVar21 = IR::Opnd::AsSymOpnd(&local_48->super_Opnd);
      bVar4 = IR::SymOpnd::IsPropertySymOpnd(pSVar21);
      if (bVar4) {
        TryOptimizeInstrWithFixedDataProperty(this_03,(Instr **)pOVar24);
        pIVar25 = (Instr *)pOVar24->_vptr_Opnd;
        pPVar22 = IR::Opnd::AsPropertySymOpnd(&local_48->super_Opnd);
        FinishOptPropOp(this_03,pIVar25,pPVar22,(BasicBlock *)0x0,false,(bool *)0x0,(bool *)0x0);
      }
    }
    if (pVVar13 != (Value *)0x0) {
      local_32[0] = (anon_union_2_4_ea848c7b_for_ValueType_13)
                    *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                     &(pVVar13->valueInfo->super_ValueType).field_0.field_0;
      bVar4 = ValueType::IsLikelyArray((ValueType *)&local_32[0].field_0);
      if (((bVar4) && (bVar4 = ValueType::IsDefinite((ValueType *)&local_32[0].field_0), !bVar4)) &&
         ((bVar4 = ValueType::IsObject((ValueType *)&local_32[0].field_0), !bVar4 &&
          (((Instr *)pOVar24->_vptr_Opnd)->m_kind == InstrKindProfiled)))) {
        pPVar23 = IR::Instr::AsProfiledInstr((Instr *)pOVar24->_vptr_Opnd);
        ValueType::ValueType((ValueType *)&local_34.field_0);
        pIVar25 = (Instr *)pOVar24->_vptr_Opnd;
        OVar1 = pIVar25->m_opcode;
        bVar29 = 1;
        if (((OVar1 == StElemC) || (OVar1 == StElemI_A)) || (OVar1 == StElemI_A_Strict)) {
          bVar4 = IR::Opnd::IsIndirOpnd(pIVar25->m_dst);
          pRVar17 = local_48;
          if ((bVar4) &&
             (pIVar15 = IR::Opnd::AsIndirOpnd((Opnd *)opnd_local->_vptr_Opnd[8]),
             pRVar17 == pIVar15->m_baseOpnd)) {
            local_34 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)(pPVar23->u).stElemInfo;
            bVar29 = ((anon_union_1_2_471f577c_for_StElemInfo_2 *)
                     ((long)(pPVar23->u).stElemInfo + 3))->bits & 0x40;
LAB_004261c7:
            bVar29 = bVar29 == 0;
          }
        }
        else if (OVar1 == LdLen_A) {
          bVar4 = IR::Opnd::IsRegOpnd(pIVar25->m_src1);
          if ((bVar4) && (local_48 == (RegOpnd *)opnd_local->_vptr_Opnd[9])) {
            local_34 = (anon_union_2_4_ea848c7b_for_ValueType_13)
                       (pPVar23->u).field_3.ldLenInfoData.f1;
            bVar29 = *(byte *)((long)&pPVar23->u + 6) ^ 1;
          }
        }
        else if (OVar1 == IsIn) {
          bVar4 = IR::Opnd::IsRegOpnd(pIVar25->m_src2);
          if ((bVar4) && (local_48 == (RegOpnd *)opnd_local->_vptr_Opnd[10])) goto LAB_004261b8;
        }
        else if ((OVar1 == LdElemI_A) &&
                ((bVar4 = IR::Opnd::IsIndirOpnd(pIVar25->m_src1), pRVar17 = local_48, bVar4 &&
                 (pIVar15 = IR::Opnd::AsIndirOpnd((Opnd *)opnd_local->_vptr_Opnd[9]),
                 pRVar17 == pIVar15->m_baseOpnd)))) {
LAB_004261b8:
          local_34 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)(pPVar23->u).ldElemInfo;
          bVar29 = ((anon_union_1_2_471f577c_for_LdElemInfo_3 *)((long)(pPVar23->u).ldElemInfo + 5))
                   ->bits & 4;
          goto LAB_004261c7;
        }
        bVar4 = ValueType::IsLikelyObject((ValueType *)&local_34.field_0);
        pOVar24 = opnd_local;
        if (bVar4) {
          OVar9 = ValueType::GetObjectType((ValueType *)&local_34.field_0);
          OVar10 = ValueType::GetObjectType((ValueType *)&local_32[0].field_0);
          if ((bVar29 & 1) == 0) {
            if ((OVar9 != OVar10) ||
               ((bVar4 = ValueType::IsLikelyNativeArray((ValueType *)&local_32[0].field_0),
                pOVar24 = opnd_local, bVar4 &&
                ((bVar4 = ValueType::HasVarElements((ValueType *)&local_34.field_0), bVar4 ||
                 ((bVar4 = ValueType::HasIntElements((ValueType *)&local_32[0].field_0),
                  pOVar24 = opnd_local, bVar4 &&
                  (bVar4 = ValueType::HasFloatElements((ValueType *)&local_34.field_0),
                  pOVar24 = opnd_local, bVar4)))))))) {
              bVar4 = ValueType::IsLikelyArray((ValueType *)&local_34.field_0);
              aVar26 = local_34;
              if (bVar4) {
                ValueType::Verify((ValueType)local_32[0].field_0);
                ValueType::Verify((ValueType)aVar26.field_0);
                bVar4 = ValueType::operator==
                                  ((ValueType *)&local_32[0].field_0,(ValueType)aVar26.field_0);
                aVar11 = local_32[0];
                if (!bVar4) {
                  ValueType::ValueType((ValueType *)&local_58,local_32[0].bits | aVar26.bits);
                  bVar4 = ValueType::OneOn((ValueType *)&local_58,Object);
                  if (bVar4) {
                    aVar11.field_0 =
                         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                         ValueType::MergeWithObject
                                   ((ValueType *)&local_32[0].field_0,aVar26.field_0);
                  }
                  else {
                    aVar11.field_0 =
                         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                         ValueType::Verify(local_58._0_2_);
                  }
                }
                local_58 = (Instr *)CONCAT62(local_58._2_6_,aVar11.bits);
                bVar4 = ValueType::HasNoMissingValues((ValueType *)&local_32[0].field_0);
                local_32[0].field_0 =
                     (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                     ValueType::SetHasNoMissingValues((ValueType *)&local_58,bVar4);
              }
              else {
                ValueType::Verify((ValueType)local_32[0].field_0);
                ValueType::Verify((ValueType)aVar26.field_0);
                bVar4 = ValueType::operator==
                                  ((ValueType *)&local_32[0].field_0,(ValueType)aVar26.field_0);
                if (!bVar4) {
                  ValueType::ValueType((ValueType *)&local_58,local_32[0].bits | aVar26.bits);
                  bVar4 = ValueType::OneOn((ValueType *)&local_58,Object);
                  if (bVar4) {
                    local_32[0].field_0 =
                         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                         ValueType::MergeWithObject
                                   ((ValueType *)&local_32[0].field_0,aVar26.field_0);
                  }
                  else {
                    local_32[0].field_0 =
                         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                         ValueType::Verify(local_58._0_2_);
                  }
                }
              }
              pBVar27 = this_03->currentBlock;
              pRVar17 = IR::Opnd::AsRegOpnd(&local_48->super_Opnd);
              pVVar19 = GlobOptBlockData::FindValue
                                  (&pBVar27->globOptData,&pRVar17->m_sym->super_Sym);
              bVar4 = true;
              goto LAB_004264ac;
            }
          }
          else {
            pOVar24 = opnd_local;
            if (((OVar9 == OVar10) &&
                (bVar4 = ValueType::IsLikelyNativeIntArray((ValueType *)&local_32[0].field_0),
                pOVar24 = opnd_local, !bVar4)) &&
               ((bVar4 = ValueType::HasIntElements((ValueType *)&local_34.field_0), bVar4 ||
                ((bVar4 = ValueType::HasVarElements((ValueType *)&local_32[0].field_0),
                 pOVar24 = opnd_local, bVar4 &&
                 (bVar4 = ValueType::HasFloatElements((ValueType *)&local_34.field_0),
                 pOVar24 = opnd_local, bVar4)))))) {
              bVar4 = ValueType::HasNoMissingValues((ValueType *)&local_32[0].field_0);
              local_32[0].field_0 =
                   (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                   ValueType::SetHasNoMissingValues((ValueType *)&local_34.field_0,bVar4);
              pBVar27 = this_03->currentBlock;
              pRVar17 = IR::Opnd::AsRegOpnd(&local_48->super_Opnd);
              pVVar19 = GlobOptBlockData::FindValue
                                  (&pBVar27->globOptData,&pRVar17->m_sym->super_Sym);
              bVar4 = false;
LAB_004264ac:
              ChangeValueType(this_03,pBVar27,pVVar19,(ValueType)local_32[0].field_0,false,bVar4);
              pOVar24 = opnd_local;
            }
          }
        }
      }
      IR::Opnd::SetValueType(&local_48->super_Opnd,(ValueType)local_32[0].field_0);
      if (this_03->prePassLoop != (Loop *)0x0) {
        return pVVar13;
      }
      bVar4 = IR::Opnd::IsSymOpnd(&local_48->super_Opnd);
      if (!bVar4) {
        return pVVar13;
      }
      bVar4 = ValueType::IsDefinite((ValueType *)&local_32[0].field_0);
      if ((!bVar4) &&
         (bVar4 = ValueType::IsNotTaggedValue((ValueType *)&local_32[0].field_0), !bVar4)) {
        return pVVar13;
      }
      pSVar21 = IR::Opnd::AsSymOpnd(&local_48->super_Opnd);
      if (pSVar21->m_sym->m_kind != SymKindProperty) {
        return pVVar13;
      }
      bVar4 = DoFieldCopyProp(this_03);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0xe5d,"(DoFieldCopyProp())","DoFieldCopyProp()");
        if (!bVar4) {
LAB_00426589:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar12 = 0;
      }
      CaptureNoImplicitCallUses(this_03,&local_48->super_Opnd,false,(Instr *)pOVar24->_vptr_Opnd);
      return pVVar13;
    }
    IR::Opnd::SetValueType(&local_48->super_Opnd,(ValueType)0x9);
    goto LAB_00426083;
  case OpndKindAddr:
    addrOpnd = IR::Opnd::AsAddrOpnd(opnd);
    pOVar24 = opnd_local;
    if ((addrOpnd->field_0x28 & 2) == 0) {
      if (((addrOpnd->addrOpndKind != AddrOpndKindDynamicVar) &&
          (addrOpnd->addrOpndKind != AddrOpndKindConstantVar)) ||
         (bVar4 = Js::TaggedInt::Is(addrOpnd->m_address), !bVar4)) {
        pVVar13 = GetVarConstantValue(this,addrOpnd);
        return pVVar13;
      }
      intConst = Js::TaggedInt::ToInt32(addrOpnd->m_address);
      goto LAB_00425819;
    }
    sourceContextId = Func::GetSourceContextId((Func *)opnd_local->_vptr_Opnd[4]);
    functionId = Func::GetLocalFunctionId((Func *)pOVar24->_vptr_Opnd[4]);
    bVar4 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01441eb0,FixedMethodsPhase,sourceContextId,functionId);
    if (bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0xd30,
                         "(!Js::Configuration::Global.flags.Off.IsEnabled(((Js::FixedMethodsPhase)), ((instr->m_func)->GetSourceContextId()), ((instr->m_func)->GetLocalFunctionId())))"
                         ,"Fixed function address operand with fixed method calls phase disabled?");
      if (!bVar4) goto LAB_00426589;
      *puVar12 = 0;
    }
    pVVar13 = NewFixedFunctionValue(this,(JavascriptFunction *)addrOpnd->m_address,addrOpnd);
    break;
  case OpndKindIndir:
    pIVar15 = IR::Opnd::AsIndirOpnd(opnd);
    OptimizeIndirUses(this,pIVar15,(Instr **)opnd_local,indirIndexValRef);
LAB_00426083:
    pVVar13 = (Value *)0x0;
    goto switchD_00425807_caseD_4;
  }
  aVar26 = (anon_union_2_4_ea848c7b_for_ValueType_13)
           *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
            &(pVVar13->valueInfo->super_ValueType).field_0.field_0;
LAB_00425c77:
  IR::Opnd::SetValueType(opnd,(ValueType)aVar26.field_0);
switchD_00425807_caseD_4:
  return pVVar13;
}

Assistant:

Value*
GlobOpt::OptSrc(IR::Opnd *opnd, IR::Instr * *pInstr, Value **indirIndexValRef, IR::IndirOpnd *parentIndirOpnd)
{
    IR::Instr * &instr = *pInstr;
    Assert(!indirIndexValRef || !*indirIndexValRef);
    Assert(
        parentIndirOpnd
            ? opnd == parentIndirOpnd->GetBaseOpnd() || opnd == parentIndirOpnd->GetIndexOpnd()
            : opnd == instr->GetSrc1() || opnd == instr->GetSrc2() || opnd == instr->GetDst() && opnd->IsIndirOpnd());

    Sym *sym;
    Value *val;
    PropertySym *originalPropertySym = nullptr;

    switch(opnd->GetKind())
    {
    case IR::OpndKindIntConst:
        val = this->GetIntConstantValue(opnd->AsIntConstOpnd()->AsInt32(), instr);
        opnd->SetValueType(val->GetValueInfo()->Type());
        return val;
    case IR::OpndKindInt64Const:
        val = this->GetIntConstantValue(opnd->AsInt64ConstOpnd()->GetValue(), instr);
        opnd->SetValueType(val->GetValueInfo()->Type());
        return val;
    case IR::OpndKindFloatConst:
    {
        const FloatConstType floatValue = opnd->AsFloatConstOpnd()->m_value;
        int32 int32Value;
        if(Js::JavascriptNumber::TryGetInt32Value(floatValue, &int32Value))
        {
            val = GetIntConstantValue(int32Value, instr);
        }
        else
        {
            val = NewFloatConstantValue(floatValue);
        }
        opnd->SetValueType(val->GetValueInfo()->Type());
        return val;
    }

    case IR::OpndKindAddr:
        {
            IR::AddrOpnd *addrOpnd = opnd->AsAddrOpnd();
            if (addrOpnd->m_isFunction)
            {
                AssertMsg(!PHASE_OFF(Js::FixedMethodsPhase, instr->m_func), "Fixed function address operand with fixed method calls phase disabled?");
                val = NewFixedFunctionValue((Js::JavascriptFunction *)addrOpnd->m_address, addrOpnd);
                opnd->SetValueType(val->GetValueInfo()->Type());
                return val;
            }
            else if (addrOpnd->IsVar() && Js::TaggedInt::Is(addrOpnd->m_address))
            {
                val = this->GetIntConstantValue(Js::TaggedInt::ToInt32(addrOpnd->m_address), instr);
                opnd->SetValueType(val->GetValueInfo()->Type());
                return val;
            }
            val = this->GetVarConstantValue(addrOpnd);
            return val;
        }

    case IR::OpndKindSym:
    {
        // Clear the opnd's value type up-front, so that this code cannot accidentally use the value type set from a previous
        // OptSrc on the same instruction (for instance, from an earlier loop prepass). The value type will be set from the
        // value if available, before returning from this function.
        opnd->SetValueType(ValueType::Uninitialized);

        sym = opnd->AsSymOpnd()->m_sym;

        // Don't create a new value for ArgSlots and don't copy prop them away.
        if (sym->IsStackSym() && sym->AsStackSym()->IsArgSlotSym())
        {
            return nullptr;
        }

        // Unless we have profile info, don't create a new value for ArgSlots and don't copy prop them away.
        if (sym->IsStackSym() && sym->AsStackSym()->IsParamSlotSym())
        {
            if (!instr->m_func->IsLoopBody() && instr->m_func->HasProfileInfo())
            {
                // Skip "this" pointer.
                int paramSlotNum = sym->AsStackSym()->GetParamSlotNum() - 2;
                if (paramSlotNum >= 0)
                {
                    const auto parameterType = instr->m_func->GetReadOnlyProfileInfo()->GetParameterInfo(static_cast<Js::ArgSlot>(paramSlotNum));
                    val = NewGenericValue(parameterType);
                    opnd->SetValueType(val->GetValueInfo()->Type());
                    return val;
                }
            }
            return nullptr;
        }

        if (!sym->IsPropertySym())
        {
            break;
        }
        originalPropertySym = sym->AsPropertySym();

        // Don't give a value to 'arguments' property sym to prevent field copy prop of 'arguments'
        if (originalPropertySym->AsPropertySym()->m_propertyId == Js::PropertyIds::arguments &&
            originalPropertySym->AsPropertySym()->m_fieldKind == PropertyKindData)
        {
            if (opnd->AsSymOpnd()->IsPropertySymOpnd())
            {
                this->FinishOptPropOp(instr, opnd->AsPropertySymOpnd());
            }
            return nullptr;
        }

        Value *const objectValue = CurrentBlockData()->FindValue(originalPropertySym->m_stackSym);
        opnd->AsSymOpnd()->SetPropertyOwnerValueType(
            objectValue ? objectValue->GetValueInfo()->Type() : ValueType::Uninitialized);

        
        sym = this->CopyPropPropertySymObj(opnd->AsSymOpnd(), instr);

        if (!DoFieldCopyProp())
        {
            if (opnd->AsSymOpnd()->IsPropertySymOpnd())
            {
                this->FinishOptPropOp(instr, opnd->AsPropertySymOpnd());
            }
            return nullptr;
        }
        switch (instr->m_opcode)
        {
            // These need the symbolic reference to the field, don't copy prop the value of the field
        case Js::OpCode::DeleteFld:
        case Js::OpCode::DeleteRootFld:
        case Js::OpCode::DeleteFldStrict:
        case Js::OpCode::DeleteRootFldStrict:
        case Js::OpCode::ScopedDeleteFld:
        case Js::OpCode::ScopedDeleteFldStrict:
        case Js::OpCode::LdMethodFromFlags:
        case Js::OpCode::BrOnNoProperty:
        case Js::OpCode::BrOnNoLocalProperty:
        case Js::OpCode::BrOnHasProperty:
        case Js::OpCode::BrOnHasLocalProperty:
        case Js::OpCode::LdMethodFldPolyInlineMiss:
        case Js::OpCode::StSlotChkUndecl:
        case Js::OpCode::ScopedLdInst:
            return nullptr;
        };

        if (instr->CallsGetter())
        {
            return nullptr;
        }

        if (this->IsLoopPrePass() && this->DoFieldPRE(this->rootLoopPrePass))
        {
            if (!this->prePassLoop->allFieldsKilled && !this->prePassLoop->fieldKilled->Test(sym->m_id))
            {
                this->SetLoopFieldInitialValue(this->rootLoopPrePass, instr, sym->AsPropertySym(), originalPropertySym);
            }
            if (this->IsPREInstrCandidateLoad(instr->m_opcode))
            {
                // Foreach property sym, remember the first instruction that loads it.
                // Can this be done in one call?
                if (!this->prePassInstrMap->ContainsKey(sym->m_id))
                {
                    this->prePassInstrMap->AddNew(sym->m_id, instr->CopyWithoutDst());
                }
            }
        }
        break; 
    }
    case IR::OpndKindReg:
        // Clear the opnd's value type up-front, so that this code cannot accidentally use the value type set from a previous
        // OptSrc on the same instruction (for instance, from an earlier loop prepass). The value type will be set from the
        // value if available, before returning from this function.
        opnd->SetValueType(ValueType::Uninitialized);

        sym = opnd->AsRegOpnd()->m_sym;
        CurrentBlockData()->MarkTempLastUse(instr, opnd->AsRegOpnd());
        if (sym->AsStackSym()->IsTypeSpec())
        {
            sym = sym->AsStackSym()->GetVarEquivSym(this->func);
        }
        break;

    case IR::OpndKindIndir:
        this->OptimizeIndirUses(opnd->AsIndirOpnd(), &instr, indirIndexValRef);
        return nullptr;

    default:
        return nullptr;
    }

    val = CurrentBlockData()->FindValue(sym);

    if (val)
    {
        Assert(CurrentBlockData()->IsLive(sym) || (sym->IsPropertySym()));
        if (instr)
        {
            opnd = this->CopyProp(opnd, instr, val, parentIndirOpnd);
        }

        // Check if we freed the operand.
        if (opnd == nullptr)
        {
            return nullptr;
        }

        // In a loop prepass, determine stack syms that are used before they are defined in the root loop for which the prepass
        // is being done. This information is used to do type specialization conversions in the landing pad where appropriate.
        if(IsLoopPrePass() &&
            sym->IsStackSym() &&
            !rootLoopPrePass->symsUsedBeforeDefined->Test(sym->m_id) &&
            rootLoopPrePass->landingPad->globOptData.IsLive(sym) && !isAsmJSFunc) // no typespec in asmjs and hence skipping this
        {
            Value *const landingPadValue = rootLoopPrePass->landingPad->globOptData.FindValue(sym);
            if(landingPadValue && val->GetValueNumber() == landingPadValue->GetValueNumber())
            {
                rootLoopPrePass->symsUsedBeforeDefined->Set(sym->m_id);
                ValueInfo *landingPadValueInfo = landingPadValue->GetValueInfo();
                if(landingPadValueInfo->IsLikelyNumber())
                {
                    rootLoopPrePass->likelyNumberSymsUsedBeforeDefined->Set(sym->m_id);
                    if(DoAggressiveIntTypeSpec() ? landingPadValueInfo->IsLikelyInt() : landingPadValueInfo->IsInt())
                    {
                        // Can only force int conversions in the landing pad based on likely-int values if aggressive int type
                        // specialization is enabled.
                        rootLoopPrePass->likelyIntSymsUsedBeforeDefined->Set(sym->m_id);
                    }
                }
            }
        }
    }
    else if ((instr->TransfersSrcValue() || OpCodeAttr::CanCSE(instr->m_opcode)) && (opnd == instr->GetSrc1() || opnd == instr->GetSrc2()))
    {
        if (sym->IsPropertySym())
        {
            val = this->CreateFieldSrcValue(sym->AsPropertySym(), originalPropertySym, &opnd, instr);
        }
        else
        {
            val = this->NewGenericValue(ValueType::Uninitialized, opnd);
        }
    }

    if (opnd->IsSymOpnd() && opnd->AsSymOpnd()->IsPropertySymOpnd())
    {
        TryOptimizeInstrWithFixedDataProperty(&instr);
        this->FinishOptPropOp(instr, opnd->AsPropertySymOpnd());
    }

    if (val)
    {
        ValueType valueType(val->GetValueInfo()->Type());

        // This block uses per-instruction profile information on array types to optimize using the best available profile
        // information and to prevent infinite bailouts by ensuring array type information is updated on bailouts.
        if (valueType.IsLikelyArray() && !valueType.IsDefinite() && !valueType.IsObject() && instr->IsProfiledInstr())
        {
            // See if we have profile data for the array type
            IR::ProfiledInstr *const profiledInstr = instr->AsProfiledInstr();
            ValueType profiledArrayType;

            bool useAggressiveSpecialization = true;
            switch(instr->m_opcode)
            {
                case Js::OpCode::LdElemI_A:
                    if(instr->GetSrc1()->IsIndirOpnd() && opnd == instr->GetSrc1()->AsIndirOpnd()->GetBaseOpnd())
                    {
                        profiledArrayType = profiledInstr->u.ldElemInfo->GetArrayType();
                        useAggressiveSpecialization = !profiledInstr->u.ldElemInfo->IsAggressiveSpecializationDisabled();
                    }
                    break;

                case Js::OpCode::StElemI_A:
                case Js::OpCode::StElemI_A_Strict:
                case Js::OpCode::StElemC:
                    if(instr->GetDst()->IsIndirOpnd() && opnd == instr->GetDst()->AsIndirOpnd()->GetBaseOpnd())
                    {
                        profiledArrayType = profiledInstr->u.stElemInfo->GetArrayType();
                        useAggressiveSpecialization = !profiledInstr->u.stElemInfo->IsAggressiveSpecializationDisabled();
                    }
                    break;

                case Js::OpCode::LdLen_A:
                    if(instr->GetSrc1()->IsRegOpnd() && opnd == instr->GetSrc1())
                    {
                        profiledArrayType = profiledInstr->u.LdLenInfo().GetArrayType();
                        useAggressiveSpecialization = !profiledInstr->u.LdLenInfo().IsAggressiveSpecializationDisabled();
                    }
                    break;

                case Js::OpCode::IsIn:
                    if (instr->GetSrc2()->IsRegOpnd() && opnd == instr->GetSrc2())
                    {
                        profiledArrayType = profiledInstr->u.ldElemInfo->GetArrayType();
                        useAggressiveSpecialization = !profiledInstr->u.ldElemInfo->IsAggressiveSpecializationDisabled();
                    }
                    break;
            }

            if (profiledArrayType.IsLikelyObject())
            {
                // Ideally we want to use the most specialized type seen by this path, but when that causes bailouts use the least specialized type instead.
                if (useAggressiveSpecialization && 
                    profiledArrayType.GetObjectType() == valueType.GetObjectType() &&
                    !valueType.IsLikelyNativeIntArray() &&
                    (
                        profiledArrayType.HasIntElements() || (valueType.HasVarElements() && profiledArrayType.HasFloatElements())
                    ))
                {
                    // use the more specialized type profiled by the instruction.
                    valueType = profiledArrayType.SetHasNoMissingValues(valueType.HasNoMissingValues());
                    ChangeValueType(this->currentBlock, CurrentBlockData()->FindValue(opnd->AsRegOpnd()->m_sym), valueType, false);
                }
                else if (!useAggressiveSpecialization && 
                    (profiledArrayType.GetObjectType() != valueType.GetObjectType() ||
                        (
                            valueType.IsLikelyNativeArray() &&
                            (
                                profiledArrayType.HasVarElements() || (valueType.HasIntElements() && profiledArrayType.HasFloatElements())
                            )
                        )
                    ))
                {
                    // Merge array type we pulled from profile with type propagated by dataflow.
                    if (profiledArrayType.IsLikelyArray())
                    {
                        valueType = valueType.Merge(profiledArrayType).SetHasNoMissingValues(valueType.HasNoMissingValues());
                    }
                    else
                    {
                        valueType = valueType.Merge(profiledArrayType);
                    }
                    ChangeValueType(this->currentBlock, CurrentBlockData()->FindValue(opnd->AsRegOpnd()->m_sym), valueType, false, true);
                }
            }
        }

        opnd->SetValueType(valueType);

        if(!IsLoopPrePass() && opnd->IsSymOpnd() && (valueType.IsDefinite() || valueType.IsNotTaggedValue()))
        {
            if (opnd->AsSymOpnd()->m_sym->IsPropertySym())
            {
                // A property sym can only be guaranteed to have a definite value type when implicit calls are disabled from the
                // point where the sym was defined with the definite value type. Insert an instruction to indicate to the
                // dead-store pass that implicit calls need to be kept disabled until after this instruction.
                Assert(DoFieldCopyProp());
                CaptureNoImplicitCallUses(opnd, false, instr);
            }
        }
    }
    else
    {
        opnd->SetValueType(ValueType::Uninitialized);
    }

    return val;
}